

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghsp(fitsfile *fptr,int *nexist,int *nmore,int *status)

{
  int *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int local_4;
  
  if (*in_RCX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = (int)((*(long *)(*(long *)(in_RDI + 2) + 0x70) -
                      *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                               (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) / 0x50);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
      if (in_RDX != (int *)0x0) {
        *in_RDX = -1;
      }
    }
    else if (in_RDX != (int *)0x0) {
      *in_RDX = (int)((*(long *)(*(long *)(in_RDI + 2) + 0x88) -
                      *(long *)(*(long *)(in_RDI + 2) + 0x70)) / 0x50) + -1;
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffghsp(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *nexist,     /* O - number of existing keywords in header */
           int *nmore,      /* O - how many more keywords will fit       */
           int *status)     /* IO - error status                         */
/*
  returns the number of existing keywords (not counting the END keyword)
  and the number of more keyword that will fit in the current header 
  without having to insert more FITS blocks.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
        *nexist = (int) (( ((fptr->Fptr)->headend) - 
                ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      if (nmore)
        *nmore = -1;   /* data not written yet, so room for any keywords */
    }
    else
    {
      /* calculate space available between the data and the END card */
      if (nmore)
        *nmore = (int) (((fptr->Fptr)->datastart - (fptr->Fptr)->headend) / 80 - 1);
    }

    return(*status);
}